

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O2

S2Cap * __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::GetCapBound
          (S2Cap *__return_storage_ptr__,S2ShapeIndexRegion<S2ShapeIndex> *this)

{
  vector<S2CellId,_std::allocator<S2CellId>_> covering;
  _Vector_base<S2CellId,_std::allocator<S2CellId>_> local_68;
  _Vector_base<S2CellId,_std::allocator<S2CellId>_> local_48;
  S2CellUnion local_28;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetCellUnionBound(this,(vector<S2CellId,_std::allocator<S2CellId>_> *)&local_68);
  local_48._M_impl.super__Vector_impl_data._M_start =
       local_68._M_impl.super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       local_68._M_impl.super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  S2CellUnion::S2CellUnion(&local_28,(vector<S2CellId,_std::allocator<S2CellId>_> *)&local_48);
  S2CellUnion::GetCapBound(__return_storage_ptr__,&local_28);
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base
            (&local_28.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>);
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base(&local_48);
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base(&local_68);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2ShapeIndexRegion<IndexType>::GetCapBound() const {
  std::vector<S2CellId> covering;
  GetCellUnionBound(&covering);
  return S2CellUnion(std::move(covering)).GetCapBound();
}